

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTexture.cpp
# Opt level: O3

int __thiscall vkt::image::Texture::layerDimension(Texture *this)

{
  int iVar1;
  
  iVar1 = 0;
  if ((ulong)this->m_type < 8) {
    iVar1 = *(int *)(&DAT_00abc6f0 + (ulong)this->m_type * 4);
  }
  return iVar1;
}

Assistant:

int Texture::layerDimension (void) const
{
	switch (m_type)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
		case IMAGE_TYPE_1D_ARRAY:
			return 1;

		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return 2;

		case IMAGE_TYPE_3D:
			return 3;

		default:
			DE_FATAL("Internal error");
			return 0;
	}
}